

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator.cpp
# Opt level: O0

void print_block(Function *f)

{
  bool bVar1;
  list<BasicBlock_*,_std::allocator<BasicBlock_*>_> *plVar2;
  reference ppBVar3;
  ostream *poVar4;
  size_type sVar5;
  undefined1 local_a0 [40];
  BasicBlock *succ;
  iterator __end3;
  iterator __begin3;
  list<BasicBlock_*,_std::allocator<BasicBlock_*>_> *__range3;
  undefined1 local_50 [40];
  BasicBlock *bb;
  iterator __end1;
  iterator __begin1;
  list<BasicBlock_*,_std::allocator<BasicBlock_*>_> *__range1;
  Function *f_local;
  
  plVar2 = Function::get_basic_blocks_abi_cxx11_(f);
  __end1 = std::__cxx11::list<BasicBlock_*,_std::allocator<BasicBlock_*>_>::begin(plVar2);
  bb = (BasicBlock *)std::__cxx11::list<BasicBlock_*,_std::allocator<BasicBlock_*>_>::end(plVar2);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&bb), bVar1) {
    ppBVar3 = std::_List_iterator<BasicBlock_*>::operator*(&__end1);
    local_50._32_8_ = *ppBVar3;
    bVar1 = BasicBlock::is_fake_block((BasicBlock *)local_50._32_8_);
    if (!bVar1) {
      Value::get_name_abi_cxx11_((Value *)local_50);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_50);
      poVar4 = std::operator<<(poVar4,"has ");
      plVar2 = BasicBlock::get_pre_basic_blocks_abi_cxx11_((BasicBlock *)local_50._32_8_);
      sVar5 = std::__cxx11::list<BasicBlock_*,_std::allocator<BasicBlock_*>_>::size(plVar2);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
      poVar4 = std::operator<<(poVar4," pre block ");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_50);
      plVar2 = BasicBlock::get_pre_basic_blocks_abi_cxx11_((BasicBlock *)local_50._32_8_);
      __end3 = std::__cxx11::list<BasicBlock_*,_std::allocator<BasicBlock_*>_>::begin(plVar2);
      succ = (BasicBlock *)
             std::__cxx11::list<BasicBlock_*,_std::allocator<BasicBlock_*>_>::end(plVar2);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&succ), bVar1) {
        ppBVar3 = std::_List_iterator<BasicBlock_*>::operator*(&__end3);
        local_a0._32_8_ = *ppBVar3;
        Value::get_name_abi_cxx11_((Value *)local_a0);
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_a0);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_a0);
        std::_List_iterator<BasicBlock_*>::operator++(&__end3);
      }
    }
    std::_List_iterator<BasicBlock_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void print_block(Function* f){
    for(auto bb: f->get_basic_blocks()){
        //std::cout << "**********" << std::endl;
        //std::cout << bb->get_name() << " is a " << (bb->is_fake_block() ? "fake block" : "true block") << std::endl;
        if(!bb->is_fake_block()){
            std::cout << bb->get_name() << "has " << bb->get_pre_basic_blocks().size() << " pre block " << std::endl;
            for(auto succ: bb->get_pre_basic_blocks()){
                std::cout<< succ->get_name() << std::endl;
            }
        }
        //std::cout << "**********" << std::endl;
    }
}